

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObjectPrivate::QObjectPrivate(QObjectPrivate *this,QtPrivate_6_10_0 param_1)

{
  undefined1 *puVar1;
  
  QObjectData::QObjectData(&this->super_QObjectData);
  (this->super_QObjectData)._vptr_QObjectData = (_func_int **)&PTR__QObjectPrivate_006ac1e8;
  (this->super_QObjectData).q_ptr = (QObject *)0x0;
  (this->super_QObjectData).parent = (QObject *)0x0;
  (this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p = (__pointer_type)0x0
  ;
  (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  (this->field_3).currentChildBeingDeleted = (QObject *)0x0;
  (this->sharedRefcount).super_QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>._q_value.
  _M_b._M_p = (__pointer_type)0x0;
  *(uint *)&(this->super_QObjectData).field_0x30 =
       *(uint *)&(this->super_QObjectData).field_0x30 & 0xffffffc0 | 0x30;
  (this->super_QObjectData).postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 0;
  this->extraData = (ExtraData *)0x0;
  (this->super_QObjectData).metaObject = (QDynamicMetaObjectData *)0x0;
  puVar1 = &(this->super_QObjectData).field_0x30;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff03f;
  return;
}

Assistant:

QObjectPrivate::QObjectPrivate(decltype(QObjectPrivateVersion))
    : threadData(nullptr), currentChildBeingDeleted(nullptr)
{
    // QObjectData initialization
    q_ptr = nullptr;
    parent = nullptr;                           // no parent yet. It is set by setParent()
    isWidget = false;                           // assume not a widget object
    blockSig = false;                           // not blocking signals
    wasDeleted = false;                         // double-delete catcher
    isDeletingChildren = false;                 // set by deleteChildren()
    sendChildEvents = true;                     // if we should send ChildAdded and ChildRemoved events to parent
    receiveChildEvents = true;
    postedEvents.storeRelaxed(0);
    extraData = nullptr;
    metaObject = nullptr;
    isWindow = false;
    deleteLaterCalled = false;
    isQuickItem = false;
    willBeWidget = false;
    wasWidget = false;
    receiveParentEvents = false;                // If object wants ParentAboutToChange and ParentChange
}